

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DbCheckPostLower.cpp
# Opt level: O2

void __thiscall DbCheckPostLower::Check(DbCheckPostLower *this,Opnd *opnd)

{
  IRType IVar1;
  code *pcVar2;
  bool bVar3;
  RegOpnd *regOpnd;
  IndirOpnd *pIVar4;
  ListOpnd *pLVar5;
  SymOpnd *pSVar6;
  StackSym *pSVar7;
  undefined4 *puVar8;
  int i;
  uint uVar9;
  long lVar10;
  
  if (opnd == (Opnd *)0x0) {
    return;
  }
  bVar3 = IR::Opnd::IsRegOpnd(opnd);
  if (bVar3) {
    regOpnd = IR::Opnd::AsRegOpnd(opnd);
LAB_003eb709:
    Check(this,regOpnd);
    return;
  }
  bVar3 = IR::Opnd::IsIndirOpnd(opnd);
  if (bVar3) {
    pIVar4 = IR::Opnd::AsIndirOpnd(opnd);
    Check(this,pIVar4->m_baseOpnd);
    pIVar4 = IR::Opnd::AsIndirOpnd(opnd);
    regOpnd = pIVar4->m_indexOpnd;
    goto LAB_003eb709;
  }
  bVar3 = IR::Opnd::IsListOpnd(opnd);
  if (bVar3) {
    pLVar5 = IR::Opnd::AsListOpnd(opnd);
    for (lVar10 = 0; lVar10 < pLVar5->count; lVar10 = lVar10 + 1) {
      Check(this,&pLVar5->opnds[lVar10]->super_Opnd);
    }
  }
  else {
    bVar3 = IR::Opnd::IsSymOpnd(opnd);
    if (!bVar3) {
      return;
    }
    pSVar6 = IR::Opnd::AsSymOpnd(opnd);
    if (pSVar6->m_sym->m_kind != SymKindStack) {
      return;
    }
    if ((this->func->field_0x242 & 0x40) != 0) {
      pSVar6 = IR::Opnd::AsSymOpnd(opnd);
      pSVar7 = Sym::AsStackSym(pSVar6->m_sym);
      if ((pSVar7->field_0x19 & 0x10) == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar8 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
                           ,0xe9,"(opnd->AsSymOpnd()->m_sym->AsStackSym()->IsAllocated())",
                           "No Stack space allocated for StackSym?");
        if (!bVar3) goto LAB_003eb896;
        *puVar8 = 0;
      }
    }
    pSVar6 = IR::Opnd::AsSymOpnd(opnd);
    pSVar7 = Sym::AsStackSym(pSVar6->m_sym);
    if ((ulong)pSVar7->m_type != 0x19) {
      uVar9 = 8;
      if (8 < TySize[pSVar7->m_type]) {
        uVar9 = TySize[pSVar7->m_type];
      }
      pSVar6 = IR::Opnd::AsSymOpnd(opnd);
      IVar1 = (pSVar6->super_Opnd).m_type;
      pSVar6 = IR::Opnd::AsSymOpnd(opnd);
      if (uVar9 < pSVar6->m_offset + TySize[IVar1]) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar8 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
                           ,0xef,
                           "(static_cast<uint>(TySize[opnd->AsSymOpnd()->GetType()]) + opnd->AsSymOpnd()->m_offset <= symSize)"
                           ,"SymOpnd cannot refer to a size greater than Sym\'s reference");
        if (!bVar3) {
LAB_003eb896:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar8 = 0;
      }
    }
  }
  return;
}

Assistant:

void DbCheckPostLower::Check(IR::Opnd *opnd)
{
    if (opnd == NULL)
    {
        return;
    }

    if (opnd->IsRegOpnd())
    {
        this->Check(opnd->AsRegOpnd());
    }
    else if (opnd->IsIndirOpnd())
    {
        this->Check(opnd->AsIndirOpnd()->GetBaseOpnd());
        this->Check(opnd->AsIndirOpnd()->GetIndexOpnd());
    }
    else if (opnd->IsListOpnd())
    {
        opnd->AsListOpnd()->Map([&](int i, IR::Opnd* opnd) { this->Check(opnd); });
    }
    else if (opnd->IsSymOpnd() && opnd->AsSymOpnd()->m_sym->IsStackSym())
    {
        if (this->func->isPostRegAlloc)
        {
            AssertMsg(opnd->AsSymOpnd()->m_sym->AsStackSym()->IsAllocated(), "No Stack space allocated for StackSym?");
        }
        IRType symType = opnd->AsSymOpnd()->m_sym->AsStackSym()->GetType();
        if (symType != TyMisc)
        {
            uint symSize = static_cast<uint>(max(TySize[symType], MachRegInt));
            AssertMsg(static_cast<uint>(TySize[opnd->AsSymOpnd()->GetType()]) + opnd->AsSymOpnd()->m_offset <= symSize, "SymOpnd cannot refer to a size greater than Sym's reference");
        }
    }
}